

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type,bool enableLangOverrides)

{
  char *__s;
  bool bVar1;
  allocator<char> local_75 [13];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  Type *pTStack_20;
  bool enableLangOverrides_local;
  Type *type_local;
  CSharpGenerator *this_local;
  
  local_21 = enableLangOverrides;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  if (enableLangOverrides) {
    bVar1 = IsEnum(type);
    if (bVar1) {
      NamespacedName_abi_cxx11_(__return_storage_ptr__,this,&pTStack_20->enum_def->super_Definition)
      ;
      return __return_storage_ptr__;
    }
    if (pTStack_20->base_type == BASE_TYPE_STRUCT) {
      NamespacedName_abi_cxx11_(&local_68,this,&pTStack_20->struct_def->super_Definition);
      std::operator+(&local_48,"Offset<",&local_68);
      std::operator+(__return_storage_ptr__,&local_48,">");
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      return __return_storage_ptr__;
    }
  }
  __s = GenTypeBasic::csharp_typename[pTStack_20->base_type];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_75);
  std::allocator<char>::~allocator(local_75);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool enableLangOverrides) const {
    // clang-format off
    static const char * const csharp_typename[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, ...) \
        #NTYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on

    if (enableLangOverrides) {
      if (IsEnum(type)) return NamespacedName(*type.enum_def);
      if (type.base_type == BASE_TYPE_STRUCT) {
        return "Offset<" + NamespacedName(*type.struct_def) + ">";
      }
    }

    return csharp_typename[type.base_type];
  }